

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

CURLcode cf_hc_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  undefined4 *puVar1;
  _Bool _Var2;
  CURLcode CVar3;
  curltime cVar4;
  curltime now_00;
  CURLcode local_6c;
  undefined4 uStack_54;
  CURLcode local_4c;
  CURLcode result;
  curltime now;
  cf_hc_ctx *ctx;
  _Bool *done_local;
  _Bool blocking_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  puVar1 = (undefined4 *)cf->ctx;
  local_4c = CURLE_OK;
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  *done = false;
  cVar4 = Curl_now();
  switch(*puVar1) {
  case 0:
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"connect, init");
    }
    *(time_t *)(puVar1 + 4) = cVar4.tv_sec;
    *(ulong *)(puVar1 + 6) = CONCAT44(uStack_54,cVar4.tv_usec);
    if ((*(byte *)(puVar1 + 0x15) & 1) == 0) {
      if ((*(byte *)(puVar1 + 0x21) & 1) != 0) {
        cf_hc_baller_init((cf_hc_baller *)(puVar1 + 0x16),cf,data,"h21",(uint)cf->conn->transport);
      }
    }
    else {
      cf_hc_baller_init((cf_hc_baller *)(puVar1 + 10),cf,data,"h3",5);
      if ((*(byte *)(puVar1 + 0x21) & 1) != 0) {
        Curl_expire(data,(ulong)(uint)puVar1[0x22],EXPIRE_ALPN_EYEBALLS);
      }
    }
    *puVar1 = 1;
  case 1:
    _Var2 = cf_hc_baller_is_active((cf_hc_baller *)(puVar1 + 10));
    if (((_Var2) &&
        (CVar3 = cf_hc_baller_connect((cf_hc_baller *)(puVar1 + 10),cf,data,done), CVar3 == CURLE_OK
        )) && ((*done & 1U) != 0)) {
      local_4c = baller_connected(cf,data,(cf_hc_baller *)(puVar1 + 10));
    }
    else {
      now_00._12_4_ = 0;
      now_00.tv_sec = SUB128(cVar4._0_12_,0);
      now_00.tv_usec = SUB124(cVar4._0_12_,8);
      _Var2 = time_to_start_h21(cf,data,now_00);
      if (_Var2) {
        cf_hc_baller_init((cf_hc_baller *)(puVar1 + 0x16),cf,data,"h21",(uint)cf->conn->transport);
      }
      _Var2 = cf_hc_baller_is_active((cf_hc_baller *)(puVar1 + 0x16));
      if (_Var2) {
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"connect, check h21");
        }
        CVar3 = cf_hc_baller_connect((cf_hc_baller *)(puVar1 + 0x16),cf,data,done);
        if ((CVar3 == CURLE_OK) && ((*done & 1U) != 0)) {
          local_4c = baller_connected(cf,data,(cf_hc_baller *)(puVar1 + 0x16));
          break;
        }
      }
      if ((((*(byte *)(puVar1 + 0x15) & 1) == 0) || (puVar1[0xe] != 0)) &&
         (((*(byte *)(puVar1 + 0x21) & 1) == 0 || (puVar1[0x1a] != 0)))) {
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
           && ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))))) {
          Curl_trc_cf_infof(data,cf,"connect, all failed");
        }
        if ((*(byte *)(puVar1 + 0x15) & 1) == 0) {
          local_6c = puVar1[0x1a];
        }
        else {
          local_6c = puVar1[0xe];
        }
        puVar1[8] = local_6c;
        local_4c = local_6c;
        *puVar1 = 3;
      }
      else {
        local_4c = CURLE_OK;
        *done = false;
      }
    }
    break;
  case 2:
    local_4c = CURLE_OK;
    cf->field_0x24 = cf->field_0x24 & 0xfe | 1;
    *done = true;
    break;
  case 3:
    local_4c = puVar1[8];
    cf->field_0x24 = cf->field_0x24 & 0xfe;
    *done = false;
  }
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf,"connect -> %d, done=%d",(ulong)local_4c,(ulong)(*done & 1));
  }
  return local_4c;
}

Assistant:

static CURLcode cf_hc_connect(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool blocking, bool *done)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct curltime now;
  CURLcode result = CURLE_OK;

  (void)blocking;
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  *done = FALSE;
  now = Curl_now();
  switch(ctx->state) {
  case CF_HC_INIT:
    DEBUGASSERT(!ctx->h3_baller.cf);
    DEBUGASSERT(!ctx->h21_baller.cf);
    DEBUGASSERT(!cf->next);
    CURL_TRC_CF(data, cf, "connect, init");
    ctx->started = now;
    if(ctx->h3_baller.enabled) {
      cf_hc_baller_init(&ctx->h3_baller, cf, data, "h3", TRNSPRT_QUIC);
      if(ctx->h21_baller.enabled)
        Curl_expire(data, ctx->soft_eyeballs_timeout_ms, EXPIRE_ALPN_EYEBALLS);
    }
    else if(ctx->h21_baller.enabled)
      cf_hc_baller_init(&ctx->h21_baller, cf, data, "h21",
                       cf->conn->transport);
    ctx->state = CF_HC_CONNECT;
    FALLTHROUGH();

  case CF_HC_CONNECT:
    if(cf_hc_baller_is_active(&ctx->h3_baller)) {
      result = cf_hc_baller_connect(&ctx->h3_baller, cf, data, done);
      if(!result && *done) {
        result = baller_connected(cf, data, &ctx->h3_baller);
        goto out;
      }
    }

    if(time_to_start_h21(cf, data, now)) {
      cf_hc_baller_init(&ctx->h21_baller, cf, data, "h21",
                        cf->conn->transport);
    }

    if(cf_hc_baller_is_active(&ctx->h21_baller)) {
      CURL_TRC_CF(data, cf, "connect, check h21");
      result = cf_hc_baller_connect(&ctx->h21_baller, cf, data, done);
      if(!result && *done) {
        result = baller_connected(cf, data, &ctx->h21_baller);
        goto out;
      }
    }

    if((!ctx->h3_baller.enabled || ctx->h3_baller.result) &&
       (!ctx->h21_baller.enabled || ctx->h21_baller.result)) {
      /* both failed or disabled. we give up */
      CURL_TRC_CF(data, cf, "connect, all failed");
      result = ctx->result = ctx->h3_baller.enabled?
                              ctx->h3_baller.result : ctx->h21_baller.result;
      ctx->state = CF_HC_FAILURE;
      goto out;
    }
    result = CURLE_OK;
    *done = FALSE;
    break;

  case CF_HC_FAILURE:
    result = ctx->result;
    cf->connected = FALSE;
    *done = FALSE;
    break;

  case CF_HC_SUCCESS:
    result = CURLE_OK;
    cf->connected = TRUE;
    *done = TRUE;
    break;
  }

out:
  CURL_TRC_CF(data, cf, "connect -> %d, done=%d", result, *done);
  return result;
}